

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importedentity.cpp
# Opt level: O2

string * __thiscall
libcellml::ImportedEntity::importReference_abi_cxx11_
          (string *__return_storage_ptr__,ImportedEntity *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&this->mPimpl->mImportReference);
  return __return_storage_ptr__;
}

Assistant:

std::string ImportedEntity::importReference() const
{
    return mPimpl->mImportReference;
}